

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
::printFailureInfo(AnalysisChecker<wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>,_wasm::analysis::ReachingDefinitionsTransferFunction>
                   *this,ostream *os)

{
  ostream *poVar1;
  char *in_RCX;
  Name name;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Error for ",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(this->txfnName)._M_dataplus._M_p,(this->txfnName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->latticeName)._M_dataplus._M_p,
                      (this->latticeName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," at lattice element seed ",0x19);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," and function ",0xe);
  name.super_IString.str._M_str = in_RCX;
  name.super_IString.str._M_len = (size_t)(this->funcName).super_IString.str._M_str;
  poVar1 = operator<<((wasm *)poVar1,(ostream *)(this->funcName).super_IString.str._M_len,name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".\n",2);
  return;
}

Assistant:

void printFailureInfo(std::ostream& os) {
    os << "Error for " << txfnName << " and " << latticeName
       << " at lattice element seed " << latticeElementSeed << " and function "
       << funcName << ".\n";
  }